

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBLookupTables.cpp
# Opt level: O2

string * GetHIDUsagePageName_abi_cxx11_(string *__return_storage_ptr__,U16 usagePage)

{
  int iVar1;
  undefined6 in_register_00000032;
  char *pcVar2;
  string local_30;
  
  iVar1 = (int)CONCAT62(in_register_00000032,usagePage);
  switch(CONCAT62(in_register_00000032,usagePage) & 0xffffffff) {
  case 0:
    pcVar2 = "Undefined";
    break;
  case 1:
    pcVar2 = "Generic Desktop Controls";
    break;
  case 2:
    pcVar2 = "Simulation Controls";
    break;
  case 3:
    pcVar2 = "VR Controls";
    break;
  case 4:
    pcVar2 = "Sport Controls";
    break;
  case 5:
    pcVar2 = "Game Controls";
    break;
  case 6:
    pcVar2 = "Generic Device Controls";
    break;
  case 7:
    pcVar2 = "Keyboard/Keypad";
    break;
  case 8:
    pcVar2 = "LEDs";
    break;
  case 9:
    pcVar2 = "Button";
    break;
  case 10:
    pcVar2 = "Ordinal";
    break;
  case 0xb:
    pcVar2 = "Telephony";
    break;
  case 0xc:
    pcVar2 = "Consumer";
    break;
  case 0xd:
    pcVar2 = "Digitizer";
    break;
  case 0xe:
  case 0x11:
  case 0x12:
  case 0x13:
switchD_001365b6_caseD_e:
    if (usagePage < 0xff00) {
      int2str_sal_abi_cxx11_
                (&local_30,(ulong)usagePage,Hexadecimal,(uint)(0xff < usagePage) * 8 + 8);
      std::operator+(__return_storage_ptr__,"Reserved ",&local_30);
    }
    else {
      int2str_sal_abi_cxx11_(&local_30,(ulong)usagePage,Hexadecimal,0x10);
      std::operator+(__return_storage_ptr__,"Vendor Usage ",&local_30);
    }
    std::__cxx11::string::~string((string *)&local_30);
    return __return_storage_ptr__;
  case 0xf:
    pcVar2 = "PID Page";
    break;
  case 0x10:
    pcVar2 = "Unicode";
    break;
  case 0x14:
    pcVar2 = "Alphanumeric Display";
    break;
  default:
    switch(iVar1) {
    case 0x80:
    case 0x81:
    case 0x82:
    case 0x83:
      pcVar2 = "Monitor page";
      break;
    case 0x84:
    case 0x85:
    case 0x86:
    case 0x87:
      pcVar2 = "Power page";
      break;
    case 0x88:
    case 0x89:
    case 0x8a:
    case 0x8b:
      goto switchD_001365b6_caseD_e;
    case 0x8c:
      pcVar2 = "Bar Code Scanner page";
      break;
    case 0x8d:
      pcVar2 = "Scale page";
      break;
    case 0x8e:
      pcVar2 = "Magnetic Stripe Reading (MSR) Devices";
      break;
    case 0x8f:
      pcVar2 = "Reserved Point of Sale pages";
      break;
    case 0x90:
      pcVar2 = "Camera Control Page";
      break;
    case 0x91:
      pcVar2 = "Arcade Page";
      break;
    default:
      if (iVar1 != 0x40) goto switchD_001365b6_caseD_e;
      pcVar2 = "Medical Instruments";
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,(allocator *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string GetHIDUsagePageName( U16 usagePage )
{
    switch( usagePage )
    {
    case 0x00:
        return "Undefined";
    case 0x01:
        return "Generic Desktop Controls";
    case 0x02:
        return "Simulation Controls";
    case 0x03:
        return "VR Controls";
    case 0x04:
        return "Sport Controls";
    case 0x05:
        return "Game Controls";
    case 0x06:
        return "Generic Device Controls";
    case 0x07:
        return "Keyboard/Keypad";
    case 0x08:
        return "LEDs";
    case 0x09:
        return "Button";
    case 0x0A:
        return "Ordinal";
    case 0x0B:
        return "Telephony";
    case 0x0C:
        return "Consumer";
    case 0x0D:
        return "Digitizer";
    case 0x0F:
        return "PID Page";
    case 0x10:
        return "Unicode";
    case 0x14:
        return "Alphanumeric Display";
    case 0x40:
        return "Medical Instruments";
    case 0x80:
    case 0x81:
    case 0x82:
    case 0x83:
        return "Monitor page";
    case 0x84:
    case 0x85:
    case 0x86:
    case 0x87:
        return "Power page";
    case 0x8C:
        return "Bar Code Scanner page";
    case 0x8D:
        return "Scale page";
    case 0x8E:
        return "Magnetic Stripe Reading (MSR) Devices";
    case 0x8F:
        return "Reserved Point of Sale pages";
    case 0x90:
        return "Camera Control Page";
    case 0x91:
        return "Arcade Page";
    }

    if( usagePage >= 0xff00 )
        return "Vendor Usage " + int2str_sal( usagePage, Hexadecimal, 16 );

    return "Reserved " + int2str_sal( usagePage, Hexadecimal, usagePage > 0xff ? 16 : 8 );
}